

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall leveldb::Arena::AllocateAligned(Arena *this,size_t bytes)

{
  long lVar1;
  ulong bytes_00;
  long in_RSI;
  ulong *in_RDI;
  long in_FS_OFFSET;
  char *result;
  size_t needed;
  size_t slop;
  size_t current_mod;
  int align;
  Arena *local_50;
  char *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI & 7) == 0) {
    local_50 = (Arena *)0x0;
  }
  else {
    local_50 = (Arena *)(8 - (*in_RDI & 7));
  }
  bytes_00 = (long)&local_50->alloc_ptr_ + in_RSI;
  if (in_RDI[1] < bytes_00) {
    local_40 = AllocateFallback(local_50,bytes_00);
  }
  else {
    local_40 = (char *)((long)&local_50->alloc_ptr_ + *in_RDI);
    *in_RDI = bytes_00 + *in_RDI;
    in_RDI[1] = in_RDI[1] - bytes_00;
  }
  if (((ulong)local_40 & 7) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return local_40;
    }
    __stack_chk_fail();
  }
  __assert_fail("(reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/arena.cc"
                ,0x36,"char *leveldb::Arena::AllocateAligned(size_t)");
}

Assistant:

char* Arena::AllocateAligned(size_t bytes) {
  const int align = (sizeof(void*) > 8) ? sizeof(void*) : 8;
  static_assert((align & (align - 1)) == 0,
                "Pointer size should be a power of 2");
  size_t current_mod = reinterpret_cast<uintptr_t>(alloc_ptr_) & (align - 1);
  size_t slop = (current_mod == 0 ? 0 : align - current_mod);
  size_t needed = bytes + slop;
  char* result;
  if (needed <= alloc_bytes_remaining_) {
    result = alloc_ptr_ + slop;
    alloc_ptr_ += needed;
    alloc_bytes_remaining_ -= needed;
  } else {
    // AllocateFallback always returned aligned memory
    result = AllocateFallback(bytes);
  }
  assert((reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0);
  return result;
}